

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::udp_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,udp_error_alert *this)

{
  error_category *peVar1;
  char *__rhs;
  bool bVar2;
  address local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_38,peVar1,(ulong)(uint)(this->error).val_);
  ::std::operator+(&local_b8,"UDP error: ",&local_38);
  ::std::operator+(&local_98,&local_b8," from: ");
  bVar2 = (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.base.sa_family !=
          2;
  if (bVar2) {
    local_f8.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)
          ((long)&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 8);
    local_f8.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)
          ((long)&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 0x10);
    local_f8.ipv6_address_.scope_id_ =
         (unsigned_long)
         (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.v6.sin6_scope_id;
    local_f8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  }
  else {
    local_f8.ipv4_address_.addr_.s_addr =
         (in4_addr_type)
         (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.v4.sin_addr.s_addr;
    local_f8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_f8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_f8.ipv6_address_.scope_id_ = 0;
  }
  local_f8.type_ = (anon_enum_32)bVar2;
  boost::asio::ip::address::to_string_abi_cxx11_(&local_d8,&local_f8);
  ::std::operator+(&local_78,&local_98,&local_d8);
  ::std::operator+(&local_58,&local_78," op: ");
  if ((ulong)this->operation < 0x2f) {
    __rhs = operation_name::names[this->operation];
  }
  else {
    __rhs = "unknown operation";
  }
  ::std::operator+(__return_storage_ptr__,&local_58,__rhs);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string udp_error_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		return "UDP error: " + error.message()
			+ " from: " + endpoint.address().to_string()
			+ " op: " + operation_name(operation);
#endif
	}